

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O1

int av1_get_palette_color_index_context
              (uint8_t *color_map,int stride,int r,int c,int palette_size,uint8_t *color_order,
              int *color_idx)

{
  ulong uVar1;
  uint8_t *puVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint local_b4 [14];
  int color_neighbors [3];
  int scores [18];
  int inverse_color_order [8];
  
  if (c < 1) {
    local_b4[0] = 0xffffffff;
  }
  else {
    local_b4[0] = (uint)color_map[(long)(r * stride + c) + -1];
    if (0 < r) {
      local_b4[1] = (uint)color_map[(long)((r + -1) * stride + c) + -1];
      goto LAB_0039ac47;
    }
  }
  local_b4[1] = 0xffffffff;
LAB_0039ac47:
  if (r < 1) {
    local_b4[2] = 0xffffffff;
  }
  else {
    local_b4[2] = (uint)color_map[(r + -1) * stride + c];
  }
  color_neighbors[1] = 0;
  color_neighbors[2] = 0;
  scores[0] = 0;
  scores[1] = 0;
  local_b4[0xb] = 0;
  local_b4[0xc] = 0;
  stack0xffffffffffffff80 = 0;
  local_b4[7] = 0;
  local_b4[8] = 0;
  local_b4[9] = 0;
  local_b4[10] = 0;
  local_b4[3] = 0;
  local_b4[4] = 0;
  local_b4[5] = 0;
  local_b4[6] = 0;
  scores[2] = 0;
  scores[3] = 0;
  lVar8 = 0;
  do {
    if (-1 < (long)*(int *)((long)local_b4 + lVar8)) {
      local_b4[(long)*(int *)((long)local_b4 + lVar8) + 3] =
           local_b4[(long)*(int *)((long)local_b4 + lVar8) + 3] +
           *(int *)((long)av1_get_palette_color_index_context::weights + lVar8);
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  iVar12 = 0;
  iVar13 = 1;
  iVar14 = 2;
  iVar15 = 3;
  uVar16 = '\0';
  uVar17 = '\x01';
  uVar18 = '\x02';
  uVar19 = '\x03';
  lVar8 = 0;
  do {
    puVar2 = color_order + lVar8;
    *puVar2 = uVar16;
    puVar2[1] = uVar17;
    puVar2[2] = uVar18;
    puVar2[3] = uVar19;
    scores[lVar8 + 6] = iVar12;
    scores[lVar8 + 7] = iVar13;
    scores[lVar8 + 8] = iVar14;
    scores[lVar8 + 9] = iVar15;
    lVar8 = lVar8 + 4;
    uVar16 = uVar16 + '\x04';
    uVar17 = uVar17 + '\x04';
    uVar18 = uVar18 + '\x04';
    uVar19 = uVar19 + '\x04';
    iVar12 = iVar12 + 4;
    iVar13 = iVar13 + 4;
    iVar14 = iVar14 + 4;
    iVar15 = iVar15 + 4;
  } while (lVar8 != 8);
  uVar9 = 1;
  uVar5 = 0;
  do {
    uVar1 = uVar5 + 1;
    uVar6 = (uint)uVar5;
    if ((long)uVar1 < (long)palette_size) {
      uVar11 = local_b4[uVar5 + 3];
      uVar7 = uVar5 & 0xffffffff;
      uVar10 = uVar9;
      do {
        uVar4 = local_b4[uVar10 + 3];
        if ((int)uVar11 < (int)uVar4) {
          uVar7 = uVar10 & 0xffffffff;
        }
        uVar6 = (uint)uVar7;
        if ((int)uVar11 < (int)uVar4) {
          uVar11 = uVar4;
        }
        uVar10 = uVar10 + 1;
      } while ((uint)palette_size != uVar10);
    }
    if (uVar5 != uVar6) {
      lVar8 = (long)(int)uVar6;
      uVar6 = local_b4[lVar8 + 3];
      bVar3 = color_order[lVar8];
      for (; (long)uVar5 < lVar8; lVar8 = lVar8 + -1) {
        local_b4[lVar8 + 3] = local_b4[lVar8 + 2];
        color_order[lVar8] = color_order[lVar8 + -1];
        scores[(ulong)color_order[lVar8 + -1] + 6] = (int)lVar8;
      }
      local_b4[uVar5 + 3] = uVar6;
      color_order[uVar5] = bVar3;
      scores[(ulong)bVar3 + 6] = (uint)uVar5;
    }
    uVar9 = uVar9 + 1;
    uVar5 = uVar1;
  } while (uVar1 != 3);
  if (color_idx != (int *)0x0) {
    *color_idx = scores[(ulong)color_map[r * stride + c] + 6];
  }
  lVar8 = 0;
  iVar12 = 0;
  do {
    iVar12 = iVar12 + *(int *)((long)av1_get_palette_color_index_context::hash_multipliers + lVar8)
                      * *(int *)((long)local_b4 + lVar8 + 0xc);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  return av1_palette_color_index_context_lookup[iVar12];
}

Assistant:

int av1_get_palette_color_index_context(const uint8_t *color_map, int stride,
                                        int r, int c, int palette_size,
                                        uint8_t *color_order, int *color_idx) {
  assert(palette_size <= PALETTE_MAX_SIZE);
  assert(r > 0 || c > 0);

  // Get color indices of neighbors.
  int color_neighbors[NUM_PALETTE_NEIGHBORS];
  color_neighbors[0] = (c - 1 >= 0) ? color_map[r * stride + c - 1] : -1;
  color_neighbors[1] =
      (c - 1 >= 0 && r - 1 >= 0) ? color_map[(r - 1) * stride + c - 1] : -1;
  color_neighbors[2] = (r - 1 >= 0) ? color_map[(r - 1) * stride + c] : -1;

  // The +10 below should not be needed. But we get a warning "array subscript
  // is above array bounds [-Werror=array-bounds]" without it, possibly due to
  // this (or similar) bug: https://gcc.gnu.org/bugzilla/show_bug.cgi?id=59124
  int scores[PALETTE_MAX_SIZE + 10] = { 0 };
  int i;
  static const int weights[NUM_PALETTE_NEIGHBORS] = { 2, 1, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    if (color_neighbors[i] >= 0) {
      scores[color_neighbors[i]] += weights[i];
    }
  }

  int inverse_color_order[PALETTE_MAX_SIZE];
  for (i = 0; i < PALETTE_MAX_SIZE; ++i) {
    color_order[i] = i;
    inverse_color_order[i] = i;
  }

  // Get the top NUM_PALETTE_NEIGHBORS scores (sorted from large to small).
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    int max = scores[i];
    int max_idx = i;
    for (int j = i + 1; j < palette_size; ++j) {
      if (scores[j] > max) {
        max = scores[j];
        max_idx = j;
      }
    }
    if (max_idx != i) {
      // Move the score at index 'max_idx' to index 'i', and shift the scores
      // from 'i' to 'max_idx - 1' by 1.
      const int max_score = scores[max_idx];
      const uint8_t max_color_order = color_order[max_idx];
      for (int k = max_idx; k > i; --k) {
        scores[k] = scores[k - 1];
        color_order[k] = color_order[k - 1];
        inverse_color_order[color_order[k]] = k;
      }
      scores[i] = max_score;
      color_order[i] = max_color_order;
      inverse_color_order[color_order[i]] = i;
    }
  }

  if (color_idx != NULL)
    *color_idx = inverse_color_order[color_map[r * stride + c]];

  // Get hash value of context.
  int color_index_ctx_hash = 0;
  static const int hash_multipliers[NUM_PALETTE_NEIGHBORS] = { 1, 2, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    color_index_ctx_hash += scores[i] * hash_multipliers[i];
  }
  assert(color_index_ctx_hash > 0);
  assert(color_index_ctx_hash <= MAX_COLOR_CONTEXT_HASH);

  // Lookup context from hash.
  const int color_index_ctx =
      av1_palette_color_index_context_lookup[color_index_ctx_hash];
  assert(color_index_ctx >= 0);
  assert(color_index_ctx < PALETTE_COLOR_INDEX_CONTEXTS);
  return color_index_ctx;
}